

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::printSolution(Plan *this)

{
  _List_node_base *p_Var1;
  long lVar2;
  long lVar3;
  difference_type __d;
  long lVar4;
  long lVar5;
  
  if (0 < this->n_stations) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      p_Var1 = (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      lVar3 = lVar5;
      lVar2 = lVar4;
      while (lVar2 != 0) {
        p_Var1 = p_Var1->_M_next;
        lVar3 = lVar3 + 1;
        lVar2 = lVar3;
      }
      Station::printAperture((Station *)p_Var1[1]._M_next,(int)lVar4);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar4 < this->n_stations);
  }
  return;
}

Assistant:

void Plan::printSolution () {
    Station *st;
    for (int s=0; s < n_stations; s++) {
      st = get_station(s);
      st->printAperture(s);
    }
  }